

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void DLevelScript::ChangeFlat(int tag,int name,bool floorOrCeiling)

{
  FTextureID tex;
  uint uVar1;
  char *name_00;
  int pos;
  FSectorTagIterator it;
  
  name_00 = FBehavior::StaticLookupString(name);
  if (name_00 != (char *)0x0) {
    tex = FTextureManager::GetTexture(&TexMan,name_00,2,2);
    if (tag == 0) {
      it.start = 0;
    }
    else {
      it.start = tagManager.TagHashFirst[tag & 0xff];
    }
    it.searchtag = tag;
    while( true ) {
      uVar1 = FSectorTagIterator::Next(&it);
      if ((int)uVar1 < 0) break;
      sector_t::SetTexture((sector_t *)(sectors + uVar1),(uint)floorOrCeiling,tex,true);
    }
  }
  return;
}

Assistant:

void DLevelScript::ChangeFlat (int tag, int name, bool floorOrCeiling)
{
	FTextureID flat;
	int secnum = -1;
	const char *flatname = FBehavior::StaticLookupString (name);

	if (flatname == NULL)
		return;

	flat = TexMan.GetTexture (flatname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		int pos = floorOrCeiling? sector_t::ceiling : sector_t::floor;
		sectors[secnum].SetTexture(pos, flat);
	}
}